

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall
minja::BinaryOpExpr::BinaryOpExpr
          (BinaryOpExpr *this,Location *loc,shared_ptr<minja::Expression> *l,
          shared_ptr<minja::Expression> *r,Op o)

{
  Expression *in_RDI;
  undefined4 in_R8D;
  Location *in_stack_ffffffffffffffc8;
  
  Expression::Expression(in_RDI,in_stack_ffffffffffffffc8);
  in_RDI->_vptr_Expression = (_func_int **)&PTR_do_evaluate_00427e98;
  std::shared_ptr<minja::Expression>::shared_ptr
            ((shared_ptr<minja::Expression> *)in_RDI,
             (shared_ptr<minja::Expression> *)in_stack_ffffffffffffffc8);
  std::shared_ptr<minja::Expression>::shared_ptr
            ((shared_ptr<minja::Expression> *)in_RDI,
             (shared_ptr<minja::Expression> *)in_stack_ffffffffffffffc8);
  *(undefined4 *)&in_RDI[2]._vptr_Expression = in_R8D;
  return;
}

Assistant:

BinaryOpExpr(const Location & loc, std::shared_ptr<Expression> && l, std::shared_ptr<Expression> && r, Op o)
        : Expression(loc), left(std::move(l)), right(std::move(r)), op(o) {}